

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_curves.cpp
# Opt level: O3

PrimInfo * __thiscall
embree::avx::
CurveGeometryISA<(embree::Geometry::GType)0,_embree::avx::CurveGeometryInterface,_embree::BSplineCurveT>
::createPrimRefArray
          (PrimInfo *__return_storage_ptr__,
          CurveGeometryISA<(embree::Geometry::GType)0,_embree::avx::CurveGeometryInterface,_embree::BSplineCurveT>
          *this,PrimRef *prims,range<unsigned_long> *r,size_t k,uint geomID)

{
  float *pfVar1;
  float *pfVar2;
  float *pfVar3;
  float fVar4;
  uint uVar5;
  BufferView<embree::Vec3fx> *pBVar6;
  char *pcVar7;
  size_t sVar8;
  undefined1 auVar9 [16];
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar10;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  float fVar23;
  float fVar24;
  float fVar25;
  float fVar26;
  float fVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  float fVar46;
  float fVar47;
  long lVar48;
  long lVar49;
  unsigned_long uVar50;
  long lVar51;
  ulong uVar52;
  undefined4 uVar53;
  long lVar54;
  ulong uVar55;
  long lVar56;
  long lVar57;
  ulong uVar58;
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [32];
  undefined1 auVar63 [16];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [32];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  float fVar74;
  undefined1 auVar72 [32];
  float fVar78;
  undefined1 auVar75 [32];
  undefined1 auVar76 [64];
  undefined1 auVar77 [64];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [64];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  float fVar87;
  undefined1 auVar86 [64];
  undefined1 auVar88 [32];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar89;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar90;
  undefined1 auVar91 [64];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar93;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar92;
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [64];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  size_t local_2e0;
  size_t local_2d8;
  float local_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float local_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  float local_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  float local_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  float local_1d8;
  float fStack_1d4;
  float fStack_1d0;
  float fStack_1cc;
  float local_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float local_198;
  float fStack_194;
  float fStack_190;
  float fStack_18c;
  float local_178;
  float fStack_174;
  float fStack_170;
  float fStack_16c;
  float local_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float local_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  float local_118;
  float fStack_114;
  float fStack_110;
  float fStack_10c;
  float local_f8;
  float fStack_f4;
  float fStack_f0;
  float fStack_ec;
  float local_d8;
  float fStack_d4;
  float fStack_d0;
  float fStack_cc;
  float local_b8;
  float fStack_b4;
  float fStack_b0;
  float fStack_ac;
  float local_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  float local_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  undefined1 auVar73 [64];
  
  __return_storage_ptr__->begin = 0;
  __return_storage_ptr__->end = 0;
  uVar52 = r->_begin;
  uVar50 = r->_end;
  if (uVar52 < uVar50) {
    auVar69._8_4_ = 0xff800000;
    auVar69._0_8_ = 0xff800000ff800000;
    auVar69._12_4_ = 0xff800000;
    auVar73 = ZEXT1664(auVar69);
    auVar60._8_4_ = 0x7f800000;
    auVar60._0_8_ = 0x7f8000007f800000;
    auVar60._12_4_ = 0x7f800000;
    auVar76 = ZEXT1664(auVar60);
    local_2e0 = 0;
    auVar79._8_4_ = 0x7fffffff;
    auVar79._0_8_ = 0x7fffffff7fffffff;
    auVar79._12_4_ = 0x7fffffff;
    auVar80._8_4_ = 0x5dccb9a2;
    auVar80._0_8_ = 0x5dccb9a25dccb9a2;
    auVar80._12_4_ = 0x5dccb9a2;
    auVar81._8_4_ = 0xddccb9a2;
    auVar81._0_8_ = 0xddccb9a2ddccb9a2;
    auVar81._12_4_ = 0xddccb9a2;
    auVar91 = ZEXT1664(auVar60);
    auVar96 = ZEXT1664(auVar69);
    local_2d8 = k;
    do {
      pBVar6 = (this->super_CurveGeometryInterface<embree::BSplineCurveT>).super_CurveGeometry.
               vertices.items;
      uVar5 = *(uint *)(*(long *)&(this->super_CurveGeometryInterface<embree::BSplineCurveT>).
                                  super_CurveGeometry.super_Geometry.field_0x58 +
                       *(long *)&(this->super_CurveGeometryInterface<embree::BSplineCurveT>).
                                 super_CurveGeometry.field_0x68 * uVar52);
      uVar55 = (ulong)(uVar5 + 3);
      if (uVar55 < (pBVar6->super_RawBufferView).num) {
        lVar51 = 0;
        do {
          lVar56 = *(long *)((long)&(pBVar6->super_RawBufferView).ptr_ofs + lVar51);
          lVar57 = *(long *)((long)&(pBVar6->super_RawBufferView).stride + lVar51);
          lVar54 = lVar57 * (ulong)uVar5;
          lVar48 = lVar57 * (ulong)(uVar5 + 1);
          lVar49 = lVar57 * (ulong)(uVar5 + 2);
          auVar69 = vinsertps_avx(ZEXT416(*(uint *)(lVar56 + 0xc + lVar54)),
                                  ZEXT416(*(uint *)(lVar56 + 0xc + lVar48)),0x10);
          auVar69 = vinsertps_avx(auVar69,ZEXT416(*(uint *)(lVar56 + 0xc + lVar49)),0x20);
          auVar69 = vinsertps_avx(auVar69,ZEXT416(*(uint *)(lVar56 + 0xc + lVar57 * uVar55)),0x30);
          auVar69 = vandps_avx(auVar69,auVar79);
          auVar69 = vcmpps_avx(auVar69,auVar80,5);
          if ((((auVar69 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar69 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar69 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar69[0xf] < '\0') goto LAB_01214cf5;
          auVar69 = *(undefined1 (*) [16])(lVar56 + lVar54);
          auVar60 = vcmpps_avx(auVar69,auVar81,6);
          auVar69 = vcmpps_avx(auVar69,auVar80,1);
          auVar69 = vandps_avx(auVar60,auVar69);
          uVar53 = vmovmskps_avx(auVar69);
          if ((~(byte)uVar53 & 7) != 0) goto LAB_01214cf5;
          auVar69 = *(undefined1 (*) [16])(lVar56 + lVar48);
          auVar60 = vcmpps_avx(auVar69,auVar81,6);
          auVar69 = vcmpps_avx(auVar69,auVar80,1);
          auVar69 = vandps_avx(auVar60,auVar69);
          uVar53 = vmovmskps_avx(auVar69);
          if ((~(byte)uVar53 & 7) != 0) goto LAB_01214cf5;
          auVar69 = *(undefined1 (*) [16])(lVar56 + lVar49);
          auVar60 = vcmpps_avx(auVar69,auVar81,6);
          auVar69 = vcmpps_avx(auVar69,auVar80,1);
          auVar69 = vandps_avx(auVar60,auVar69);
          uVar53 = vmovmskps_avx(auVar69);
          if ((~(byte)uVar53 & 7) != 0) goto LAB_01214cf5;
          auVar69 = *(undefined1 (*) [16])(lVar56 + lVar57 * uVar55);
          auVar60 = vcmpps_avx(auVar69,auVar81,6);
          auVar69 = vcmpps_avx(auVar69,auVar80,1);
          auVar69 = vandps_avx(auVar60,auVar69);
          uVar53 = vmovmskps_avx(auVar69);
          if ((~(byte)uVar53 & 7) != 0) goto LAB_01214cf5;
          lVar51 = lVar51 + 0x38;
        } while ((ulong)((this->super_CurveGeometryInterface<embree::BSplineCurveT>).
                         super_CurveGeometry.super_Geometry.numTimeSteps - 1) * 0x38 + 0x38 !=
                 lVar51);
        pcVar7 = (pBVar6->super_RawBufferView).ptr_ofs;
        sVar8 = (pBVar6->super_RawBufferView).stride;
        lVar51 = uVar5 * sVar8;
        auVar69 = *(undefined1 (*) [16])(pcVar7 + lVar51);
        lVar56 = (uVar5 + 1) * sVar8;
        auVar60 = *(undefined1 (*) [16])(pcVar7 + lVar56);
        lVar57 = (uVar5 + 2) * sVar8;
        auVar61 = *(undefined1 (*) [16])(pcVar7 + lVar57);
        auVar82 = *(undefined1 (*) [16])(pcVar7 + uVar55 * sVar8);
        fVar4 = (this->super_CurveGeometryInterface<embree::BSplineCurveT>).super_CurveGeometry.
                maxRadiusScale;
        fVar12 = fVar4 * *(float *)(pcVar7 + lVar51 + 0xc);
        fVar13 = fVar4 * *(float *)(pcVar7 + lVar56 + 0xc);
        fVar14 = fVar4 * *(float *)(pcVar7 + lVar57 + 0xc);
        fVar4 = fVar4 * *(float *)(pcVar7 + uVar55 * sVar8 + 0xc);
        uVar5 = (this->super_CurveGeometryInterface<embree::BSplineCurveT>).super_CurveGeometry.
                tessellationRate;
        uVar55 = (ulong)uVar5;
        auVar70 = auVar73._0_16_;
        auVar67 = ZEXT416((uint)fVar4);
        auVar84 = ZEXT416((uint)fVar14);
        auVar66 = ZEXT416((uint)fVar13);
        if (uVar55 == 4) {
          auVar9 = vinsertps_avx(auVar82,ZEXT416((uint)fVar4),0x30);
          auVar15 = vshufps_avx(auVar82,auVar82,0);
          auVar59 = vshufps_avx(auVar82,auVar82,0x55);
          auVar16 = vshufps_avx(auVar82,auVar82,0xaa);
          auVar67 = vshufps_avx(ZEXT416((uint)fVar4),auVar67,0);
          auVar71 = vshufps_avx(auVar61,auVar61,0);
          auVar85 = vshufps_avx(auVar61,auVar61,0x55);
          auVar82 = vinsertps_avx(auVar61,ZEXT416((uint)fVar14),0x30);
          auVar17 = vshufps_avx(auVar61,auVar61,0xaa);
          auVar61 = vinsertps_avx(auVar60,ZEXT416((uint)fVar13),0x30);
          auVar84 = vshufps_avx(ZEXT416((uint)fVar14),auVar84,0);
          auVar18 = vshufps_avx(auVar60,auVar60,0);
          auVar19 = vshufps_avx(auVar60,auVar60,0x55);
          auVar60 = vshufps_avx(auVar60,auVar60,0xaa);
          auVar20 = vshufps_avx(auVar69,auVar69,0);
          auVar66 = vshufps_avx(ZEXT416((uint)fVar13),auVar66,0);
          auVar21 = vshufps_avx(auVar69,auVar69,0x55);
          auVar69 = vshufps_avx(auVar69,auVar69,0xaa);
          auVar22 = vshufps_avx(ZEXT416((uint)fVar12),ZEXT416((uint)fVar12),0);
          auVar63._0_4_ =
               auVar20._0_4_ * (float)bspline_basis0._272_4_ +
               (float)bspline_basis0._1428_4_ * auVar18._0_4_ +
               auVar71._0_4_ * (float)bspline_basis0._2584_4_ +
               auVar15._0_4_ * (float)bspline_basis0._3740_4_;
          auVar63._4_4_ =
               auVar20._4_4_ * (float)bspline_basis0._276_4_ +
               (float)bspline_basis0._1432_4_ * auVar18._4_4_ +
               auVar71._4_4_ * (float)bspline_basis0._2588_4_ +
               auVar15._4_4_ * (float)bspline_basis0._3744_4_;
          auVar63._8_4_ =
               auVar20._8_4_ * (float)bspline_basis0._280_4_ +
               (float)bspline_basis0._1436_4_ * auVar18._8_4_ +
               auVar71._8_4_ * (float)bspline_basis0._2592_4_ +
               auVar15._8_4_ * (float)bspline_basis0._3748_4_;
          auVar63._12_4_ =
               auVar20._12_4_ * (float)bspline_basis0._284_4_ +
               (float)bspline_basis0._1440_4_ * auVar18._12_4_ +
               auVar71._12_4_ * (float)bspline_basis0._2596_4_ +
               auVar15._12_4_ * (float)bspline_basis0._3752_4_;
          auVar71._0_4_ =
               auVar21._0_4_ * (float)bspline_basis0._272_4_ +
               (float)bspline_basis0._1428_4_ * auVar19._0_4_ +
               auVar85._0_4_ * (float)bspline_basis0._2584_4_ +
               auVar59._0_4_ * (float)bspline_basis0._3740_4_;
          auVar71._4_4_ =
               auVar21._4_4_ * (float)bspline_basis0._276_4_ +
               (float)bspline_basis0._1432_4_ * auVar19._4_4_ +
               auVar85._4_4_ * (float)bspline_basis0._2588_4_ +
               auVar59._4_4_ * (float)bspline_basis0._3744_4_;
          auVar71._8_4_ =
               auVar21._8_4_ * (float)bspline_basis0._280_4_ +
               (float)bspline_basis0._1436_4_ * auVar19._8_4_ +
               auVar85._8_4_ * (float)bspline_basis0._2592_4_ +
               auVar59._8_4_ * (float)bspline_basis0._3748_4_;
          auVar71._12_4_ =
               auVar21._12_4_ * (float)bspline_basis0._284_4_ +
               (float)bspline_basis0._1440_4_ * auVar19._12_4_ +
               auVar85._12_4_ * (float)bspline_basis0._2596_4_ +
               auVar59._12_4_ * (float)bspline_basis0._3752_4_;
          auVar85._0_4_ =
               auVar69._0_4_ * (float)bspline_basis0._272_4_ +
               auVar60._0_4_ * (float)bspline_basis0._1428_4_ +
               auVar17._0_4_ * (float)bspline_basis0._2584_4_ +
               auVar16._0_4_ * (float)bspline_basis0._3740_4_;
          auVar85._4_4_ =
               auVar69._4_4_ * (float)bspline_basis0._276_4_ +
               auVar60._4_4_ * (float)bspline_basis0._1432_4_ +
               auVar17._4_4_ * (float)bspline_basis0._2588_4_ +
               auVar16._4_4_ * (float)bspline_basis0._3744_4_;
          auVar85._8_4_ =
               auVar69._8_4_ * (float)bspline_basis0._280_4_ +
               auVar60._8_4_ * (float)bspline_basis0._1436_4_ +
               auVar17._8_4_ * (float)bspline_basis0._2592_4_ +
               auVar16._8_4_ * (float)bspline_basis0._3748_4_;
          auVar85._12_4_ =
               auVar69._12_4_ * (float)bspline_basis0._284_4_ +
               auVar60._12_4_ * (float)bspline_basis0._1440_4_ +
               auVar17._12_4_ * (float)bspline_basis0._2596_4_ +
               auVar16._12_4_ * (float)bspline_basis0._3752_4_;
          auVar59._0_4_ =
               auVar22._0_4_ * (float)bspline_basis0._272_4_ +
               auVar66._0_4_ * (float)bspline_basis0._1428_4_ +
               auVar84._0_4_ * (float)bspline_basis0._2584_4_ +
               auVar67._0_4_ * (float)bspline_basis0._3740_4_;
          auVar59._4_4_ =
               auVar22._4_4_ * (float)bspline_basis0._276_4_ +
               auVar66._4_4_ * (float)bspline_basis0._1432_4_ +
               auVar84._4_4_ * (float)bspline_basis0._2588_4_ +
               auVar67._4_4_ * (float)bspline_basis0._3744_4_;
          auVar59._8_4_ =
               auVar22._8_4_ * (float)bspline_basis0._280_4_ +
               auVar66._8_4_ * (float)bspline_basis0._1436_4_ +
               auVar84._8_4_ * (float)bspline_basis0._2592_4_ +
               auVar67._8_4_ * (float)bspline_basis0._3748_4_;
          auVar59._12_4_ =
               auVar22._12_4_ * (float)bspline_basis0._284_4_ +
               auVar66._12_4_ * (float)bspline_basis0._1440_4_ +
               auVar84._12_4_ * (float)bspline_basis0._2596_4_ +
               auVar67._12_4_ * (float)bspline_basis0._3752_4_;
          auVar84 = vshufps_avx(auVar63,auVar63,0xb1);
          auVar69 = vminps_avx(auVar84,auVar63);
          auVar60 = vshufpd_avx(auVar69,auVar69,1);
          auVar69 = vminps_avx(auVar60,auVar69);
          auVar66 = vshufps_avx(auVar71,auVar71,0xb1);
          auVar60 = vminps_avx(auVar66,auVar71);
          auVar67 = vshufpd_avx(auVar60,auVar60,1);
          auVar60 = vminps_avx(auVar67,auVar60);
          auVar69 = vinsertps_avx(auVar69,auVar60,0x1c);
          auVar15 = vshufps_avx(auVar85,auVar85,0xb1);
          auVar60 = vminps_avx(auVar15,auVar85);
          auVar67 = vshufpd_avx(auVar60,auVar60,1);
          auVar60 = vminps_avx(auVar67,auVar60);
          auVar60 = vinsertps_avx(auVar69,auVar60,0x20);
          auVar69 = vmaxps_avx(auVar84,auVar63);
          auVar67 = vshufpd_avx(auVar69,auVar69,1);
          auVar69 = vmaxps_avx(auVar67,auVar69);
          auVar67 = vmaxps_avx(auVar66,auVar71);
          auVar84 = vshufpd_avx(auVar67,auVar67,1);
          auVar67 = vmaxps_avx(auVar84,auVar67);
          auVar69 = vinsertps_avx(auVar69,auVar67,0x1c);
          auVar67 = vmaxps_avx(auVar15,auVar85);
          auVar84 = vshufpd_avx(auVar67,auVar67,1);
          auVar67 = vmaxps_avx(auVar84,auVar67);
          auVar67 = vinsertps_avx(auVar69,auVar67,0x20);
          auVar69 = vandps_avx(auVar59,auVar79);
          auVar84 = vshufps_avx(auVar69,auVar69,0xb1);
          auVar69 = vmaxps_avx(auVar84,auVar69);
          auVar84 = vshufps_avx(auVar69,auVar69,0);
          auVar69 = vshufps_avx(auVar69,auVar69,0xaa);
          auVar84 = vmaxps_avx(auVar69,auVar84);
          auVar66._0_4_ =
               auVar61._0_4_ * 0.16666667 + auVar82._0_4_ * 0.6666667 + auVar9._0_4_ * 0.16666667;
          auVar66._4_4_ =
               auVar61._4_4_ * 0.16666667 + auVar82._4_4_ * 0.6666667 + auVar9._4_4_ * 0.16666667;
          auVar66._8_4_ =
               auVar61._8_4_ * 0.16666667 + auVar82._8_4_ * 0.6666667 + auVar9._8_4_ * 0.16666667;
          auVar66._12_4_ =
               auVar61._12_4_ * 0.16666667 + auVar82._12_4_ * 0.6666667 + auVar9._12_4_ * 0.16666667
          ;
          auVar82 = vminps_avx(auVar60,auVar66);
          auVar60 = vmaxps_avx(auVar67,auVar66);
          auVar69 = vshufps_avx(auVar66,auVar66,0xff);
          auVar69 = vandps_avx(auVar69,auVar79);
          auVar61 = vmaxps_avx(auVar84,auVar69);
          auVar69 = vsubps_avx(auVar82,auVar61);
          auVar82._0_4_ = auVar60._0_4_ + auVar61._0_4_;
          auVar82._4_4_ = auVar60._4_4_ + auVar61._4_4_;
          auVar82._8_4_ = auVar60._8_4_ + auVar61._8_4_;
          auVar82._12_4_ = auVar60._12_4_ + auVar61._12_4_;
        }
        else {
          if ((int)uVar5 < 0) {
            auVar65 = ZEXT832(0);
            auVar88._8_4_ = 0xff800000;
            auVar88._0_8_ = 0xff800000ff800000;
            auVar88._12_4_ = 0xff800000;
            auVar88._16_4_ = 0xff800000;
            auVar88._20_4_ = 0xff800000;
            auVar88._24_4_ = 0xff800000;
            auVar88._28_4_ = 0xff800000;
            auVar94._8_4_ = 0x7f800000;
            auVar94._0_8_ = 0x7f8000007f800000;
            auVar94._12_4_ = 0x7f800000;
            auVar94._16_4_ = 0x7f800000;
            auVar94._20_4_ = 0x7f800000;
            auVar94._24_4_ = 0x7f800000;
            auVar94._28_4_ = 0x7f800000;
            auVar98 = auVar88;
            auVar95 = auVar94;
            auVar99 = auVar94;
            auVar97 = auVar88;
          }
          else {
            auVar9 = vpshufd_avx(ZEXT416(uVar5),0);
            auVar15 = vshufps_avx(auVar69,auVar69,0);
            auVar59 = vshufps_avx(auVar69,auVar69,0x55);
            auVar69 = vshufps_avx(auVar69,auVar69,0xaa);
            auVar16 = vshufps_avx(ZEXT416((uint)fVar12),ZEXT416((uint)fVar12),0);
            auVar71 = vshufps_avx(auVar60,auVar60,0);
            auVar85 = vshufps_avx(auVar60,auVar60,0x55);
            auVar60 = vshufps_avx(auVar60,auVar60,0xaa);
            auVar66 = vshufps_avx(auVar66,auVar66,0);
            auVar17 = vshufps_avx(auVar61,auVar61,0);
            auVar18 = vshufps_avx(auVar61,auVar61,0x55);
            auVar61 = vshufps_avx(auVar61,auVar61,0xaa);
            auVar84 = vshufps_avx(auVar84,auVar84,0);
            auVar19 = vshufps_avx(auVar82,auVar82,0);
            auVar20 = vshufps_avx(auVar82,auVar82,0x55);
            auVar86 = ZEXT1664(auVar20);
            auVar82 = vshufps_avx(auVar82,auVar82,0xaa);
            auVar83 = ZEXT1664(auVar82);
            auVar67 = vshufps_avx(auVar67,auVar67,0);
            lVar51 = uVar55 * 0x44;
            uVar58 = 0;
            auVar77 = ZEXT864(0);
            auVar94._8_4_ = 0x7f800000;
            auVar94._0_8_ = 0x7f8000007f800000;
            auVar94._12_4_ = 0x7f800000;
            auVar94._16_4_ = 0x7f800000;
            auVar94._20_4_ = 0x7f800000;
            auVar94._24_4_ = 0x7f800000;
            auVar94._28_4_ = 0x7f800000;
            auVar98._8_4_ = 0xff800000;
            auVar98._0_8_ = 0xff800000ff800000;
            auVar98._12_4_ = 0xff800000;
            auVar98._16_4_ = 0xff800000;
            auVar98._20_4_ = 0xff800000;
            auVar98._24_4_ = 0xff800000;
            auVar98._28_4_ = 0xff800000;
            auVar88 = auVar98;
            auVar95 = auVar94;
            auVar97 = auVar98;
            auVar99 = auVar94;
            do {
              auVar22 = vpshufd_avx(ZEXT416((uint)uVar58),0);
              auVar21 = vpor_avx(auVar22,_DAT_01f7fcf0);
              auVar22 = vpor_avx(auVar22,_DAT_01fafea0);
              auVar21 = vpcmpgtd_avx(auVar21,auVar9);
              auVar22 = vpcmpgtd_avx(auVar22,auVar9);
              auVar68._16_16_ = auVar22;
              auVar68._0_16_ = auVar21;
              pfVar1 = (float *)(lVar51 + 0x21af430 + uVar58 * 4);
              fVar4 = *pfVar1;
              fVar12 = pfVar1[1];
              fVar13 = pfVar1[2];
              fVar14 = pfVar1[3];
              fVar23 = pfVar1[4];
              fVar24 = pfVar1[5];
              fVar25 = pfVar1[6];
              pfVar2 = (float *)(lVar51 + 0x21af8b4 + uVar58 * 4);
              fVar26 = *pfVar2;
              fVar27 = pfVar2[1];
              fVar28 = pfVar2[2];
              fVar29 = pfVar2[3];
              fVar30 = pfVar2[4];
              fVar31 = pfVar2[5];
              fVar32 = pfVar2[6];
              local_1f8 = auVar19._0_4_;
              fStack_1f4 = auVar19._4_4_;
              fStack_1f0 = auVar19._8_4_;
              fStack_1ec = auVar19._12_4_;
              local_218 = auVar20._0_4_;
              fStack_214 = auVar20._4_4_;
              fStack_210 = auVar20._8_4_;
              fStack_20c = auVar20._12_4_;
              local_238 = auVar82._0_4_;
              fStack_234 = auVar82._4_4_;
              fStack_230 = auVar82._8_4_;
              fStack_22c = auVar82._12_4_;
              local_178 = auVar17._0_4_;
              fStack_174 = auVar17._4_4_;
              fStack_170 = auVar17._8_4_;
              fStack_16c = auVar17._12_4_;
              fVar87 = auVar86._28_4_;
              fVar74 = fVar87 + auVar73._28_4_;
              local_198 = auVar18._0_4_;
              fStack_194 = auVar18._4_4_;
              fStack_190 = auVar18._8_4_;
              fStack_18c = auVar18._12_4_;
              fVar78 = fVar87 + auVar77._28_4_;
              local_1b8 = auVar61._0_4_;
              fStack_1b4 = auVar61._4_4_;
              fStack_1b0 = auVar61._8_4_;
              fStack_1ac = auVar61._12_4_;
              pfVar3 = (float *)(lVar51 + 0x21aefac + uVar58 * 4);
              fVar33 = *pfVar3;
              fVar34 = pfVar3[1];
              fVar35 = pfVar3[2];
              fVar36 = pfVar3[3];
              fVar37 = pfVar3[4];
              fVar38 = pfVar3[5];
              fVar39 = pfVar3[6];
              fVar40 = pfVar3[7];
              local_258 = auVar67._0_4_;
              fStack_254 = auVar67._4_4_;
              fStack_250 = auVar67._8_4_;
              fStack_24c = auVar67._12_4_;
              local_1d8 = auVar84._0_4_;
              fStack_1d4 = auVar84._4_4_;
              fStack_1d0 = auVar84._8_4_;
              fStack_1cc = auVar84._12_4_;
              local_f8 = auVar71._0_4_;
              fStack_f4 = auVar71._4_4_;
              fStack_f0 = auVar71._8_4_;
              fStack_ec = auVar71._12_4_;
              local_118 = auVar85._0_4_;
              fStack_114 = auVar85._4_4_;
              fStack_110 = auVar85._8_4_;
              fStack_10c = auVar85._12_4_;
              local_138 = auVar60._0_4_;
              fStack_134 = auVar60._4_4_;
              fStack_130 = auVar60._8_4_;
              fStack_12c = auVar60._12_4_;
              pfVar3 = (float *)(bspline_basis0 + uVar58 * 4 + lVar51);
              fVar41 = *pfVar3;
              fVar42 = pfVar3[1];
              fVar43 = pfVar3[2];
              fVar44 = pfVar3[3];
              fVar45 = pfVar3[4];
              fVar46 = pfVar3[5];
              fVar47 = pfVar3[6];
              local_158 = auVar66._0_4_;
              fStack_154 = auVar66._4_4_;
              fStack_150 = auVar66._8_4_;
              fStack_14c = auVar66._12_4_;
              local_78 = auVar15._0_4_;
              fStack_74 = auVar15._4_4_;
              fStack_70 = auVar15._8_4_;
              fStack_6c = auVar15._12_4_;
              auVar64._0_4_ =
                   fVar41 * local_78 + fVar33 * local_f8 + fVar4 * local_178 + fVar26 * local_1f8;
              auVar64._4_4_ =
                   fVar42 * fStack_74 +
                   fVar34 * fStack_f4 + fVar12 * fStack_174 + fVar27 * fStack_1f4;
              auVar64._8_4_ =
                   fVar43 * fStack_70 +
                   fVar35 * fStack_f0 + fVar13 * fStack_170 + fVar28 * fStack_1f0;
              auVar64._12_4_ =
                   fVar44 * fStack_6c +
                   fVar36 * fStack_ec + fVar14 * fStack_16c + fVar29 * fStack_1ec;
              auVar64._16_4_ =
                   fVar45 * local_78 + fVar37 * local_f8 + fVar23 * local_178 + fVar30 * local_1f8;
              auVar64._20_4_ =
                   fVar46 * fStack_74 +
                   fVar38 * fStack_f4 + fVar24 * fStack_174 + fVar31 * fStack_1f4;
              auVar64._24_4_ =
                   fVar47 * fStack_70 +
                   fVar39 * fStack_f0 + fVar25 * fStack_170 + fVar32 * fStack_1f0;
              auVar64._28_4_ = fVar40 + pfVar2[7] + fVar74;
              local_98 = auVar59._0_4_;
              fStack_94 = auVar59._4_4_;
              fStack_90 = auVar59._8_4_;
              fStack_8c = auVar59._12_4_;
              auVar72._0_4_ =
                   fVar41 * local_98 + fVar33 * local_118 + fVar4 * local_198 + fVar26 * local_218;
              auVar72._4_4_ =
                   fVar42 * fStack_94 +
                   fVar34 * fStack_114 + fVar12 * fStack_194 + fVar27 * fStack_214;
              auVar72._8_4_ =
                   fVar43 * fStack_90 +
                   fVar35 * fStack_110 + fVar13 * fStack_190 + fVar28 * fStack_210;
              auVar72._12_4_ =
                   fVar44 * fStack_8c +
                   fVar36 * fStack_10c + fVar14 * fStack_18c + fVar29 * fStack_20c;
              auVar72._16_4_ =
                   fVar45 * local_98 + fVar37 * local_118 + fVar23 * local_198 + fVar30 * local_218;
              auVar72._20_4_ =
                   fVar46 * fStack_94 +
                   fVar38 * fStack_114 + fVar24 * fStack_194 + fVar31 * fStack_214;
              auVar72._24_4_ =
                   fVar47 * fStack_90 +
                   fVar39 * fStack_110 + fVar25 * fStack_190 + fVar32 * fStack_210;
              auVar72._28_4_ = fVar40 + fVar74 + fVar78;
              auVar73 = ZEXT3264(auVar72);
              auVar65 = vminps_avx(auVar95,auVar64);
              auVar95 = vblendvps_avx(auVar65,auVar95,auVar68);
              local_b8 = auVar69._0_4_;
              fStack_b4 = auVar69._4_4_;
              fStack_b0 = auVar69._8_4_;
              fStack_ac = auVar69._12_4_;
              auVar75._0_4_ =
                   fVar41 * local_b8 + fVar4 * local_1b8 + fVar26 * local_238 + fVar33 * local_138;
              auVar75._4_4_ =
                   fVar42 * fStack_b4 +
                   fVar12 * fStack_1b4 + fVar27 * fStack_234 + fVar34 * fStack_134;
              auVar75._8_4_ =
                   fVar43 * fStack_b0 +
                   fVar13 * fStack_1b0 + fVar28 * fStack_230 + fVar35 * fStack_130;
              auVar75._12_4_ =
                   fVar44 * fStack_ac +
                   fVar14 * fStack_1ac + fVar29 * fStack_22c + fVar36 * fStack_12c;
              auVar75._16_4_ =
                   fVar45 * local_b8 + fVar23 * local_1b8 + fVar30 * local_238 + fVar37 * local_138;
              auVar75._20_4_ =
                   fVar46 * fStack_b4 +
                   fVar24 * fStack_1b4 + fVar31 * fStack_234 + fVar38 * fStack_134;
              auVar75._24_4_ =
                   fVar47 * fStack_b0 +
                   fVar25 * fStack_1b0 + fVar32 * fStack_230 + fVar39 * fStack_130;
              auVar75._28_4_ = auVar65._28_4_ + fVar87 + auVar83._28_4_ + fVar78;
              auVar65 = vminps_avx(auVar94,auVar72);
              auVar94 = vblendvps_avx(auVar65,auVar94,auVar68);
              auVar65 = vminps_avx(auVar99,auVar75);
              auVar86 = ZEXT3264(auVar65);
              auVar99 = vblendvps_avx(auVar65,auVar99,auVar68);
              local_d8 = auVar16._0_4_;
              fStack_d4 = auVar16._4_4_;
              fStack_d0 = auVar16._8_4_;
              fStack_cc = auVar16._12_4_;
              auVar83 = ZEXT3264(CONCAT428(pfVar3[7],
                                           CONCAT424(fVar47 * fStack_d0,
                                                     CONCAT420(fVar46 * fStack_d4,
                                                               CONCAT416(fVar45 * local_d8,
                                                                         CONCAT412(fVar44 * 
                                                  fStack_cc,
                                                  CONCAT48(fVar43 * fStack_d0,
                                                           CONCAT44(fVar42 * fStack_d4,
                                                                    fVar41 * local_d8))))))));
              auVar62._0_4_ =
                   fVar41 * local_d8 + fVar33 * local_158 + fVar4 * local_1d8 + fVar26 * local_258;
              auVar62._4_4_ =
                   fVar42 * fStack_d4 +
                   fVar34 * fStack_154 + fVar12 * fStack_1d4 + fVar27 * fStack_254;
              auVar62._8_4_ =
                   fVar43 * fStack_d0 +
                   fVar35 * fStack_150 + fVar13 * fStack_1d0 + fVar28 * fStack_250;
              auVar62._12_4_ =
                   fVar44 * fStack_cc +
                   fVar36 * fStack_14c + fVar14 * fStack_1cc + fVar29 * fStack_24c;
              auVar62._16_4_ =
                   fVar45 * local_d8 + fVar37 * local_158 + fVar23 * local_1d8 + fVar30 * local_258;
              auVar62._20_4_ =
                   fVar46 * fStack_d4 +
                   fVar38 * fStack_154 + fVar24 * fStack_1d4 + fVar31 * fStack_254;
              auVar62._24_4_ =
                   fVar47 * fStack_d0 +
                   fVar39 * fStack_150 + fVar25 * fStack_1d0 + fVar32 * fStack_250;
              auVar62._28_4_ = pfVar3[7] + fVar40 + pfVar1[7] + pfVar2[7];
              auVar65 = vmaxps_avx(auVar88,auVar64);
              auVar88 = vblendvps_avx(auVar65,auVar88,auVar68);
              auVar65 = vmaxps_avx(auVar97,auVar72);
              auVar97 = vblendvps_avx(auVar65,auVar97,auVar68);
              auVar65 = vmaxps_avx(auVar98,auVar75);
              auVar98 = vblendvps_avx(auVar65,auVar98,auVar68);
              auVar65._8_4_ = 0x7fffffff;
              auVar65._0_8_ = 0x7fffffff7fffffff;
              auVar65._12_4_ = 0x7fffffff;
              auVar65._16_4_ = 0x7fffffff;
              auVar65._20_4_ = 0x7fffffff;
              auVar65._24_4_ = 0x7fffffff;
              auVar65._28_4_ = 0x7fffffff;
              auVar65 = vandps_avx(auVar62,auVar65);
              auVar65 = vmaxps_avx(auVar77._0_32_,auVar65);
              auVar65 = vblendvps_avx(auVar65,auVar77._0_32_,auVar68);
              auVar77 = ZEXT3264(auVar65);
              uVar58 = uVar58 + 8;
            } while (uVar58 <= uVar55);
          }
          auVar62 = vshufps_avx(auVar95,auVar95,0xb1);
          auVar95 = vminps_avx(auVar95,auVar62);
          auVar62 = vshufpd_avx(auVar95,auVar95,5);
          auVar95 = vminps_avx(auVar95,auVar62);
          auVar69 = vminps_avx(auVar95._0_16_,auVar95._16_16_);
          auVar95 = vshufps_avx(auVar94,auVar94,0xb1);
          auVar95 = vminps_avx(auVar94,auVar95);
          auVar94 = vshufpd_avx(auVar95,auVar95,5);
          auVar95 = vminps_avx(auVar95,auVar94);
          auVar60 = vminps_avx(auVar95._0_16_,auVar95._16_16_);
          auVar60 = vunpcklps_avx(auVar69,auVar60);
          auVar95 = vshufps_avx(auVar99,auVar99,0xb1);
          auVar95 = vminps_avx(auVar99,auVar95);
          auVar94 = vshufpd_avx(auVar95,auVar95,5);
          auVar95 = vminps_avx(auVar95,auVar94);
          auVar69 = vminps_avx(auVar95._0_16_,auVar95._16_16_);
          auVar69 = vinsertps_avx(auVar60,auVar69,0x28);
          auVar95 = vshufps_avx(auVar88,auVar88,0xb1);
          auVar95 = vmaxps_avx(auVar88,auVar95);
          auVar94 = vshufpd_avx(auVar95,auVar95,5);
          auVar95 = vmaxps_avx(auVar95,auVar94);
          auVar60 = vmaxps_avx(auVar95._0_16_,auVar95._16_16_);
          auVar95 = vshufps_avx(auVar97,auVar97,0xb1);
          auVar95 = vmaxps_avx(auVar97,auVar95);
          auVar94 = vshufpd_avx(auVar95,auVar95,5);
          auVar95 = vmaxps_avx(auVar95,auVar94);
          auVar61 = vmaxps_avx(auVar95._0_16_,auVar95._16_16_);
          auVar61 = vunpcklps_avx(auVar60,auVar61);
          auVar95 = vshufps_avx(auVar98,auVar98,0xb1);
          auVar95 = vmaxps_avx(auVar98,auVar95);
          auVar94 = vshufpd_avx(auVar95,auVar95,5);
          auVar95 = vmaxps_avx(auVar95,auVar94);
          auVar60 = vmaxps_avx(auVar95._0_16_,auVar95._16_16_);
          auVar60 = vinsertps_avx(auVar61,auVar60,0x28);
          auVar95 = vshufps_avx(auVar65,auVar65,0xb1);
          auVar95 = vmaxps_avx(auVar65,auVar95);
          auVar94 = vshufpd_avx(auVar95,auVar95,5);
          auVar95 = vmaxps_avx(auVar95,auVar94);
          auVar61 = vmaxps_avx(auVar95._0_16_,auVar95._16_16_);
          auVar61 = vshufps_avx(auVar61,auVar61,0);
          auVar69 = vsubps_avx(auVar69,auVar61);
          auVar82._0_4_ = auVar60._0_4_ + auVar61._0_4_;
          auVar82._4_4_ = auVar60._4_4_ + auVar61._4_4_;
          auVar82._8_4_ = auVar60._8_4_ + auVar61._8_4_;
          auVar82._12_4_ = auVar60._12_4_ + auVar61._12_4_;
        }
        auVar60 = vandps_avx(auVar69,auVar79);
        auVar61 = vandps_avx(auVar82,auVar79);
        auVar60 = vmaxps_avx(auVar60,auVar61);
        auVar61 = vmovshdup_avx(auVar60);
        auVar61 = vmaxss_avx(auVar61,auVar60);
        auVar60 = vshufpd_avx(auVar60,auVar60,1);
        auVar60 = vmaxss_avx(auVar60,auVar61);
        auVar60 = ZEXT416((uint)(auVar60._0_4_ * 4.7683716e-07));
        auVar60 = vshufps_avx(auVar60,auVar60,0);
        auVar69 = vsubps_avx(auVar69,auVar60);
        aVar10 = (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1)
                 vinsertps_avx(auVar69,ZEXT416(geomID),0x30);
        auVar61._0_4_ = auVar82._0_4_ + auVar60._0_4_;
        auVar61._4_4_ = auVar82._4_4_ + auVar60._4_4_;
        auVar61._8_4_ = auVar82._8_4_ + auVar60._8_4_;
        auVar61._12_4_ = auVar82._12_4_ + auVar60._12_4_;
        aVar11 = (anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1)
                 vinsertps_avx(auVar61,ZEXT416((uint)uVar52),0x30);
        auVar69 = vminps_avx(auVar76._0_16_,(undefined1  [16])aVar10);
        auVar76 = ZEXT1664(auVar69);
        auVar69 = vmaxps_avx(auVar70,(undefined1  [16])aVar11);
        auVar73 = ZEXT1664(auVar69);
        auVar67._0_4_ = aVar10.x + aVar11.x;
        auVar67._4_4_ = aVar10.y + aVar11.y;
        auVar67._8_4_ = aVar10.z + aVar11.z;
        auVar67._12_4_ = aVar10.field_3.w + aVar11.field_3.w;
        auVar69 = vminps_avx(auVar91._0_16_,auVar67);
        auVar91 = ZEXT1664(auVar69);
        auVar69 = vmaxps_avx(auVar96._0_16_,auVar67);
        auVar96 = ZEXT1664(auVar69);
        local_2e0 = local_2e0 + 1;
        prims[local_2d8].upper.field_0.field_1 = aVar11;
        prims[local_2d8].lower.field_0.field_1 = aVar10;
        uVar50 = r->_end;
        local_2d8 = local_2d8 + 1;
      }
LAB_01214cf5:
      aVar92 = auVar96._0_16_;
      aVar89 = auVar91._0_16_;
      aVar93 = auVar73._0_16_;
      aVar90 = auVar76._0_16_;
      uVar52 = uVar52 + 1;
    } while (uVar52 < uVar50);
  }
  else {
    aVar90.m128[2] = INFINITY;
    aVar90._0_8_ = 0x7f8000007f800000;
    aVar90.m128[3] = INFINITY;
    aVar93.m128[2] = -INFINITY;
    aVar93._0_8_ = 0xff800000ff800000;
    aVar93.m128[3] = -INFINITY;
    local_2e0 = 0;
    aVar89 = aVar90;
    aVar92 = aVar93;
  }
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.lower.field_0 =
       aVar90;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).geomBounds.upper.field_0 =
       aVar93;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.lower.field_0 =
       aVar89;
  (__return_storage_ptr__->super_CentGeom<embree::BBox<embree::Vec3fa>_>).centBounds.upper.field_0 =
       aVar92;
  __return_storage_ptr__->end = local_2e0;
  return __return_storage_ptr__;
}

Assistant:

PrimInfo createPrimRefArray(PrimRef* prims, const range<size_t>& r, size_t k, unsigned int geomID) const
      {
        PrimInfo pinfo(empty);
        for (size_t j=r.begin(); j<r.end(); j++)
        {
          if (!valid(ctype, j, make_range<size_t>(0, numTimeSegments()))) continue;
          const BBox3fa box = bounds(j);
          const PrimRef prim(box,geomID,unsigned(j));
          pinfo.add_center2(prim);
          prims[k++] = prim;
        }
        return pinfo;
      }